

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd-obj.c
# Opt level: O2

void do_cmd_quaff_potion(command *cmd)

{
  _Bool _Var1;
  wchar_t wVar2;
  object *obj;
  
  _Var1 = player_get_resume_normal_shape(player,cmd);
  if (_Var1) {
    wVar2 = cmd_get_item((command_conflict *)cmd,"item",&obj,"Quaff which potion? ",
                         "You have no potions from which to quaff.",tval_is_potion,L'\x06');
    if (wVar2 == L'\0') {
      use_aux(cmd,obj,USE_SINGLE,L'\f');
    }
  }
  return;
}

Assistant:

void do_cmd_quaff_potion(struct command *cmd)
{
	struct object *obj;

	if (!player_get_resume_normal_shape(player, cmd)) {
		return;
	}

	/* Get an item */
	if (cmd_get_item(cmd, "item", &obj,
			"Quaff which potion? ",
			"You have no potions from which to quaff.",
			tval_is_potion,
			USE_INVEN | USE_FLOOR) != CMD_OK) return;

	(void)use_aux(cmd, obj, USE_SINGLE, MSG_QUAFF);
}